

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::ResultBuilder::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,ResultBuilder *this)

{
  undefined8 *puVar1;
  string *__lhs;
  string *__lhs_00;
  string *__rhs;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long *plVar8;
  size_type *psVar9;
  ulong *puVar10;
  ulong uVar11;
  undefined1 auVar12 [8];
  size_type *psVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long local_60;
  long lStack_58;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  
  __lhs = &(this->m_exprComponents).op;
  iVar3 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar3 == 0) {
    if ((this->m_exprComponents).lhs._M_string_length != 0) {
      std::operator+(__return_storage_ptr__,__lhs,&(this->m_exprComponents).lhs);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->m_assertionInfo).capturedExpression._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (this->m_assertionInfo).capturedExpression._M_string_length);
    return __return_storage_ptr__;
  }
  iVar3 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar3 == 0) {
    psVar13 = &__str_1._M_string_length;
    pcVar2 = (this->m_exprComponents).lhs._M_dataplus._M_p;
    local_50 = (undefined1  [8])psVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + (this->m_exprComponents).lhs._M_string_length);
    std::__cxx11::string::append((char *)local_50);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               (local_50,(ulong)(this->m_exprComponents).rhs._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar9) {
      lVar4 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    auVar12 = local_50;
LAB_001356b6:
    if (auVar12 == (undefined1  [8])psVar13) {
      return __return_storage_ptr__;
    }
    goto LAB_001356bb;
  }
  iVar3 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar3 == 0) {
    std::operator+(&local_130,"{can\'t expand - use ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    puVar10 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar10) {
      local_c0 = *puVar10;
      lStack_b8 = plVar5[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar10;
      local_d0 = (ulong *)*plVar5;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)puVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::substr
              ((ulong)&local_f0,(ulong)&(this->m_assertionInfo).capturedExpression);
    uVar11 = 0xf;
    if (local_d0 != &local_c0) {
      uVar11 = local_c0;
    }
    if (uVar11 < (ulong)(local_e8 + local_c8)) {
      uVar11 = 0xf;
      if (local_f0 != local_e0) {
        uVar11 = local_e0[0];
      }
      if (uVar11 < (ulong)(local_e8 + local_c8)) goto LAB_00135760;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_00135760:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
    }
    local_b0 = &local_a0;
    puVar1 = puVar6 + 2;
    if ((undefined8 *)*puVar6 == puVar1) {
      local_a0 = *puVar1;
      uStack_98 = puVar6[3];
    }
    else {
      local_a0 = *puVar1;
      local_b0 = (undefined8 *)*puVar6;
    }
    local_a8 = puVar6[1];
    *puVar6 = puVar1;
    puVar6[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_110 = &local_100;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_100 = *plVar8;
      lStack_f8 = plVar5[3];
    }
    else {
      local_100 = *plVar8;
      local_110 = (long *)*plVar5;
    }
    local_108 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,
                                (ulong)(this->m_assertionInfo).macroName._M_dataplus._M_p);
    psVar13 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar13) {
      __str._M_string_length = *psVar13;
      __str.field_2._M_allocated_capacity = plVar5[3];
      local_90 = (undefined1  [8])&__str._M_string_length;
    }
    else {
      __str._M_string_length = *psVar13;
      local_90 = (undefined1  [8])*plVar5;
    }
    __str._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar13;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append(local_90);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_60 = *plVar5;
      lStack_58 = puVar6[3];
      __str.field_2._8_8_ = &local_60;
    }
    else {
      local_60 = *plVar5;
      __str.field_2._8_8_ = (long *)*puVar6;
    }
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               (__str.field_2._M_local_buf + 8,
                                (ulong)(this->m_assertionInfo).capturedExpression._M_dataplus._M_p);
    psVar13 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar13) {
      __str_1._M_string_length = *psVar13;
      __str_1.field_2._M_allocated_capacity = plVar5[3];
      local_50 = (undefined1  [8])&__str_1._M_string_length;
    }
    else {
      __str_1._M_string_length = *psVar13;
      local_50 = (undefined1  [8])*plVar5;
    }
    __str_1._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar13;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar13 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar13) {
      lVar4 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar13;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_50 != (undefined1  [8])&__str_1._M_string_length) {
      operator_delete((void *)local_50);
    }
    if ((long *)__str.field_2._8_8_ != &local_60) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if (local_90 != (undefined1  [8])&__str._M_string_length) {
      operator_delete((void *)local_90);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    paVar7 = &local_130.field_2;
  }
  else {
    if (0x27 < (this->m_exprComponents).rhs._M_string_length +
               (this->m_exprComponents).lhs._M_string_length) {
LAB_00135410:
      psVar13 = &__str._M_string_length;
      pcVar2 = (this->m_exprComponents).lhs._M_dataplus._M_p;
      local_90 = (undefined1  [8])psVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar2,pcVar2 + (this->m_exprComponents).lhs._M_string_length);
      std::__cxx11::string::append((char *)local_90);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 (local_90,(ulong)(this->m_exprComponents).op._M_dataplus._M_p);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar5[3];
        __str.field_2._8_8_ = &local_60;
      }
      else {
        local_60 = *plVar8;
        __str.field_2._8_8_ = (long *)*plVar5;
      }
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        __str_1._M_string_length = *psVar9;
        __str_1.field_2._M_allocated_capacity = plVar5[3];
        local_50 = (undefined1  [8])&__str_1._M_string_length;
      }
      else {
        __str_1._M_string_length = *psVar9;
        local_50 = (undefined1  [8])*plVar5;
      }
      __str_1._M_dataplus._M_p = (pointer)plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 (local_50,(ulong)(this->m_exprComponents).rhs._M_dataplus._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        lVar4 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_50 != (undefined1  [8])&__str_1._M_string_length) {
        operator_delete((void *)local_50);
      }
      auVar12 = local_90;
      if ((long *)__str.field_2._8_8_ != &local_60) {
        operator_delete((void *)__str.field_2._8_8_);
        auVar12 = local_90;
      }
      goto LAB_001356b6;
    }
    __lhs_00 = &(this->m_exprComponents).lhs;
    lVar4 = std::__cxx11::string::find((char *)__lhs_00,0x167b26,0);
    if (lVar4 != -1) goto LAB_00135410;
    __rhs = &(this->m_exprComponents).rhs;
    lVar4 = std::__cxx11::string::find((char *)__rhs,0x167b26,0);
    if (lVar4 != -1) goto LAB_00135410;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   __lhs_00," ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__str.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   __lhs);
    plVar5 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    psVar13 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar13) {
      __str_1._M_string_length = *psVar13;
      __str_1.field_2._M_allocated_capacity = plVar5[3];
      local_50 = (undefined1  [8])&__str_1._M_string_length;
    }
    else {
      __str_1._M_string_length = *psVar13;
      local_50 = (undefined1  [8])*plVar5;
    }
    __str_1._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar13;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   __rhs);
    if (local_50 != (undefined1  [8])&__str_1._M_string_length) {
      operator_delete((void *)local_50);
    }
    if ((long *)__str.field_2._8_8_ != &local_60) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&__str._M_string_length;
  }
  auVar12 = (undefined1  [8])(&paVar7->_M_allocated_capacity)[-2];
  if (auVar12 == (undefined1  [8])paVar7) {
    return __return_storage_ptr__;
  }
LAB_001356bb:
  operator_delete((void *)auVar12);
  return __return_storage_ptr__;
}

Assistant:

std::string ResultBuilder::reconstructExpression() const {
		if (m_exprComponents.op == "")
			return m_exprComponents.lhs.empty() ? m_assertionInfo.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
		else if (m_exprComponents.op == "matches")
			return m_exprComponents.lhs + " " + m_exprComponents.rhs;
		else if (m_exprComponents.op != "!") {
			if (m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
				m_exprComponents.lhs.find("\n") == std::string::npos &&
				m_exprComponents.rhs.find("\n") == std::string::npos)
				return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
			else
				return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
		}
		else
			return "{can't expand - use " + m_assertionInfo.macroName + "_FALSE( " + m_assertionInfo.capturedExpression.substr(1) + " ) instead of " + m_assertionInfo.macroName + "( " + m_assertionInfo.capturedExpression + " ) for better diagnostics}";
	}